

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examine_stack.cc
# Opt level: O2

void absl::lts_20250127::debugging_internal::anon_unknown_0::DumpPCAndFrameSize
               (OutputWriter *writer,void *writer_arg,void *pc,int framesize,char *prefix)

{
  char *__format;
  char buf [100];
  
  if (framesize < 1) {
    __format = "%s@ %*p  (unknown)\n";
  }
  else {
    __format = "%s@ %*p  %9d\n";
  }
  snprintf(buf,100,__format,prefix,0x12,pc);
  (*writer)(buf,writer_arg);
  return;
}

Assistant:

void DumpPCAndFrameSize(OutputWriter* writer, void* writer_arg, void* const pc,
                        int framesize, const char* const prefix) {
  char buf[100];
  if (framesize <= 0) {
    snprintf(buf, sizeof(buf), "%s@ %*p  (unknown)\n", prefix,
             kPrintfPointerFieldWidth, pc);
  } else {
    snprintf(buf, sizeof(buf), "%s@ %*p  %9d\n", prefix,
             kPrintfPointerFieldWidth, pc, framesize);
  }
  writer(buf, writer_arg);
}